

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::PhraseTests_Disjoint_Test::PhraseTests_Disjoint_Test(PhraseTests_Disjoint_Test *this)

{
  PhraseTests_Disjoint_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PhraseTests_Disjoint_Test_001bde38;
  return;
}

Assistant:

TEST(PhraseTests, Disjoint) {
  EXPECT_TRUE(disjoint(Span{0, 0}, {0, 1}));
  EXPECT_TRUE(disjoint(Span{0, 0}, {1, 1}));
  EXPECT_TRUE(disjoint(Span{0, 1}, {1, 2}));
  EXPECT_TRUE(disjoint(Span{0, 1}, {1, 1}));
  EXPECT_TRUE(disjoint(Span{1, 1}, {0, 1}));
  EXPECT_FALSE(disjoint(Span{0, 1}, {0, 2}));
  EXPECT_FALSE(disjoint(Span{0, 4}, {1, 2}));
  EXPECT_FALSE(disjoint(Span{3, 4}, {0, 4}));
}